

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

uint Abc_TtCanonicizePhase(word *pTruth,int nVars)

{
  word wVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uCanonPhase;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar10 = (ulong)(uint)(1 << ((byte)nVars - 6 & 0x1f));
  if (nVars < 7) {
    uVar10 = 1;
  }
  uCanonPhase = 0;
  iVar4 = (int)uVar10;
  Abc_TtCopy(Abc_TtCanonicizePhase::pCopy1,pTruth,iVar4,0);
  uVar6 = nVars;
  if ((long)pTruth[(long)iVar4 + -1] < 0) {
    Abc_TtNot(pTruth,iVar4);
    uCanonPhase = 1 << ((byte)nVars & 0x1f);
  }
  do {
    uVar3 = uVar6 - 1;
    if ((int)uVar6 < 7) {
      do {
        if ((int)uVar3 < 0) {
          Abc_TtCopy(Abc_TtCanonicizePhase::pCopy2,pTruth,iVar4,0);
          Abc_TtImplementNpnConfig(Abc_TtCanonicizePhase::pCopy2,nVars,(char *)0x0,uCanonPhase);
          iVar4 = Abc_TtEqual(Abc_TtCanonicizePhase::pCopy1,Abc_TtCanonicizePhase::pCopy2,iVar4);
          if (iVar4 == 0) {
            puts("Canonical form verification failed!");
          }
          return uCanonPhase;
        }
        uVar6 = 1 << ((byte)uVar3 & 0x1f);
        uVar8 = s_Truths6[uVar3];
        uVar13 = uVar10;
        puVar14 = pTruth + uVar10;
        do {
          puVar14 = puVar14 + -1;
          if ((int)uVar13 < 1) goto LAB_004293fe;
          bVar5 = (byte)uVar6;
          uVar16 = *puVar14 << (bVar5 & 0x3f) & uVar8;
          uVar15 = *puVar14 & uVar8;
          uVar13 = (ulong)((int)uVar13 - 1);
        } while (uVar16 == uVar15);
        if (uVar16 <= uVar15) {
          for (; -1 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
            pTruth[uVar13] =
                 (pTruth[uVar13] & uVar8) >> (bVar5 & 0x3f) |
                 pTruth[uVar13] << (bVar5 & 0x3f) & uVar8;
          }
          uCanonPhase = uCanonPhase ^ uVar6;
        }
LAB_004293fe:
        uVar3 = uVar3 - 1;
      } while( true );
    }
    iVar9 = 1 << ((char)uVar6 - 7U & 0x1f);
    uVar11 = iVar4 - iVar9;
    uVar8 = uVar10;
    while (uVar12 = (int)uVar8 - 1, uVar6 = uVar3, 1 < (int)uVar8) {
      if (pTruth[(int)(uVar12 - iVar9)] != pTruth[uVar12]) {
        if (pTruth[(int)(uVar12 - iVar9)] <= pTruth[uVar12]) {
          while (0 < (int)uVar12) {
            wVar1 = pTruth[(int)(uVar12 - iVar9)];
            pTruth[(int)(uVar12 - iVar9)] = pTruth[uVar12];
            pTruth[uVar12] = wVar1;
            uVar7 = uVar11 - iVar9;
            uVar2 = uVar7 - iVar9;
            if (uVar12 != uVar11) {
              uVar7 = uVar12;
              uVar2 = uVar11;
            }
            uVar11 = uVar2;
            uVar12 = uVar7 - 1;
          }
          if (uVar12 != 0xffffffff) {
            __assert_fail("w == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                          ,0x485,"int Abc_TtCanonicizePhaseVar6(word *, int, int)");
          }
          uCanonPhase = uCanonPhase ^ 1 << (uVar3 & 0x1f);
        }
        break;
      }
      uVar6 = uVar11 - iVar9;
      uVar7 = uVar6 - iVar9;
      if (uVar12 != uVar11) {
        uVar6 = uVar12;
        uVar7 = uVar11;
      }
      uVar11 = uVar7;
      uVar8 = (ulong)uVar6;
    }
  } while( true );
}

Assistant:

unsigned Abc_TtCanonicizePhase( word * pTruth, int nVars )
{
    unsigned uCanonPhase = 0;
    int v, nWords = Abc_TtWordNum( nVars );
//    static int Counter = 0;
//    Counter++;

#ifdef CANON_VERIFY
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    if ( (pTruth[nWords-1] >> 63) & 1 )
    {
        Abc_TtNot( pTruth, nWords );
        uCanonPhase ^= (1 << nVars);
    }

//    while ( 1 )
//    {
//        unsigned uCanonPhase2 = uCanonPhase;
        for ( v = nVars - 1; v >= 6; v-- )
            if ( Abc_TtCanonicizePhaseVar6( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
        for ( ; v >= 0; v-- )
            if ( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
//        if ( uCanonPhase2 == uCanonPhase )
//            break;
//    }

//    for ( v = 5; v >= 0; v-- )
//        assert( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) != 1 );

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    Abc_TtImplementNpnConfig( pCopy2, nVars, NULL, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
    return uCanonPhase;
}